

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCV.cpp
# Opt level: O2

void __thiscall
TCV::checkIfClassFunctionCalledWithRightAccess
          (TCV *this,string *nodeName,ASTNode *_node,bool isCalledOnFunction)

{
  bool bVar1;
  ASTNode *pAVar2;
  string *varName;
  Variable *this_00;
  Class *this_01;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Function_*,_std::allocator<Function_*>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Function_*,_std::allocator<Function_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *this_02;
  mapped_type *__x;
  Function *pFVar3;
  undefined3 in_register_00000009;
  string errorString;
  string objectType;
  mapped_type functions;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_88;
  string local_68;
  _Vector_base<Function_*,_std::allocator<Function_*>_> local_48;
  
  pAVar2 = AST::ASTNode::getParent(_node);
  pAVar2 = AST::ASTNode::getChild(pAVar2,lastProcessedNode);
  pAVar2 = AST::ASTNode::getChild(pAVar2,0);
  if (CONCAT31(in_register_00000009,isCalledOnFunction) == 0) {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    local_68._M_string_length = 0;
    local_68.field_2._M_local_buf[0] = '\0';
LAB_0012811b:
    bVar1 = std::operator==(&this->currentFuncName,"main");
    if (bVar1) {
      pFVar3 = this->symbolTable->main;
      varName = AST::ASTNode::getName_abi_cxx11_(pAVar2);
    }
    else {
      pFVar3 = this->currentFunction;
      varName = AST::ASTNode::getName_abi_cxx11_(pAVar2);
    }
    this_00 = Function::getVariable(pFVar3,varName);
    Variable::getType_abi_cxx11_(this_00);
    std::__cxx11::string::_M_assign((string *)&local_68);
  }
  else {
    std::__cxx11::string::string((string *)&local_68,(string *)&this->returnType);
    if (local_68._M_string_length == 0) goto LAB_0012811b;
  }
  this_01 = Semantic::SymbolTable::getClass(this->symbolTable,&local_68);
  this_02 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Function_*,_std::allocator<Function_*>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Function_*,_std::allocator<Function_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             *)Class::getFunctions_abi_cxx11_(this_01);
  __x = std::__detail::
        _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Function_*,_std::allocator<Function_*>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Function_*,_std::allocator<Function_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
        ::at(this_02,nodeName);
  std::vector<Function_*,_std::allocator<Function_*>_>::vector
            ((vector<Function_*,_std::allocator<Function_*>_> *)&local_48,__x);
  pFVar3 = getRightFunction(this,(vector<Function_*,_std::allocator<Function_*>_> *)&local_48,_node)
  ;
  if (pFVar3 == (Function *)0x0) {
    std::operator+(&bStack_88,"no matching function name ",nodeName);
    Semantic::Detector::addError(this->detector,&bStack_88);
  }
  else {
    if (pFVar3->visibility != PRIVATE) {
      Function::getReturnType_abi_cxx11_(pFVar3);
      std::__cxx11::string::_M_assign((string *)&this->returnType);
      goto LAB_00128218;
    }
    std::operator+(&bStack_88,"Accessing private function name ",nodeName);
    Semantic::Detector::addError(this->detector,&bStack_88);
  }
  std::__cxx11::string::~string((string *)&bStack_88);
LAB_00128218:
  std::_Vector_base<Function_*,_std::allocator<Function_*>_>::~_Vector_base(&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

void
TCV::checkIfClassFunctionCalledWithRightAccess(std::string &nodeName, AST::ASTNode *_node, bool isCalledOnFunction) {
    auto object = _node->getParent()->getChild(lastProcessedNode)->getChild(0);

    //if there is a chain of function calls, the return type
    //of the last processed function is the object type that
    //next function should be called on.
    std::string objectType = isCalledOnFunction ? returnType : std::string();

    //if in main function scope, we need to fetch main function local variable
    if (objectType.empty()) {
        if (currentFuncName == "main") objectType = symbolTable->main->getVariable(object->getName())->getType();
        else objectType = currentFunction->getVariable(object->getName())->getType();
    }
    auto functions = symbolTable->getClass(objectType)->getFunctions().at(nodeName);

    auto function = getRightFunction(functions, _node);
    if (function != nullptr && function->isPrivate()) {
        std::string errorString = "Accessing private function name " + nodeName;
        detector->addError(errorString);
    } else if (function == nullptr) {
        std::string errorString = "no matching function name " + nodeName;
        detector->addError(errorString);
    } else returnType = function->getReturnType();

}